

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  float local_5c;
  ImRect local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((GImGui->NavId == id) &&
     ((((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar1 = GImGui->CurrentWindow, (pIVar1->DC).NavHideHighlightOneFrame == false)))) {
    local_5c = 0.0;
    if ((flags & 8U) == 0) {
      local_5c = (GImGui->Style).FrameRounding;
    }
    local_58.Min = bb->Min;
    local_58.Max = bb->Max;
    ImRect::ClipWith(&local_58,&pIVar1->ClipRect);
    if ((flags & 1U) != 0) {
      local_58.Min.y = local_58.Min.y + -4.0;
      local_58.Min.x = local_58.Min.x + -4.0;
      local_58.Max.y = local_58.Max.y + 4.0;
      local_58.Max.x = local_58.Max.x + 4.0;
      bVar3 = ImRect::Contains(&pIVar1->ClipRect,&local_58);
      if (!bVar3) {
        ImDrawList::PushClipRect(pIVar1->DrawList,local_58.Min,local_58.Max,false);
      }
      pIVar2 = pIVar1->DrawList;
      local_38.y = local_58.Min.y + 1.0;
      local_38.x = local_58.Min.x + 1.0;
      local_40.x = local_58.Max.x + -1.0;
      local_40.y = local_58.Max.y + -1.0;
      IVar4 = GetColorU32(0x33,1.0);
      ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar4,local_5c,0xf,2.0);
      if (!bVar3) {
        ImDrawList::PopClipRect(pIVar1->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar2 = pIVar1->DrawList;
      IVar4 = GetColorU32(0x33,1.0);
      ImDrawList::AddRect(pIVar2,&local_58.Min,&local_58.Max,IVar4,local_5c,-1,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}